

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# App.cpp
# Opt level: O3

void __thiscall cursespp::App::App(App *this,string *title)

{
  string *psVar1;
  long lVar2;
  runtime_error *this_00;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar4;
  bool bVar5;
  string lcCType;
  string lang;
  string lcAll;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_e0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_d0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_c0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_b8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_b0;
  WindowState *local_a8;
  string *local_a0;
  string *local_98;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_90;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_80;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_70;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_60;
  string *local_50;
  undefined8 local_48;
  undefined4 local_40;
  uint uStack_3c;
  
  (this->injectedKeys).c.
  super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Deque_impl_data._M_finish._M_last = (_Elt_pointer)0x0;
  (this->injectedKeys).c.
  super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Deque_impl_data._M_finish._M_node = (_Map_pointer)0x0;
  (this->injectedKeys).c.
  super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Deque_impl_data._M_finish._M_cur = (_Elt_pointer)0x0;
  (this->injectedKeys).c.
  super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Deque_impl_data._M_finish._M_first = (_Elt_pointer)0x0;
  (this->injectedKeys).c.
  super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Deque_impl_data._M_start._M_last = (_Elt_pointer)0x0;
  (this->injectedKeys).c.
  super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
  (this->injectedKeys).c.
  super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
  (this->injectedKeys).c.
  super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Deque_impl_data._M_start._M_first = (_Elt_pointer)0x0;
  (this->injectedKeys).c.
  super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Deque_impl_data._M_map = (_Map_pointer)0x0;
  (this->injectedKeys).c.
  super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Deque_impl_data._M_map_size = 0;
  std::
  _Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::_M_initialize_map((_Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)this,0);
  memset(&this->state,0,0xb0);
  this->colorMode = Palette;
  this->bgType = Theme;
  local_b0 = &(this->colorTheme).field_2;
  (this->colorTheme)._M_dataplus._M_p = (pointer)local_b0;
  (this->colorTheme)._M_string_length = 0;
  (this->colorTheme).field_2._M_local_buf[0] = '\0';
  psVar1 = &this->quitKey;
  local_b8 = &(this->quitKey).field_2;
  (this->quitKey)._M_dataplus._M_p = (pointer)local_b8;
  local_a8 = &this->state;
  std::__cxx11::string::_M_construct<char_const*>((string *)psVar1,"^D","");
  this->mouseEnabled = true;
  this->quit = false;
  this->initialized = false;
  local_c0 = &(this->appTitle).field_2;
  (this->appTitle)._M_dataplus._M_p = (pointer)local_c0;
  (this->appTitle)._M_string_length = 0;
  (this->appTitle).field_2._M_local_buf[0] = '\0';
  local_a0 = psVar1;
  if (instance == (App *)0x0) {
    local_d0._M_allocated_capacity._0_4_ = 0x415f434c;
    local_d0._M_allocated_capacity._4_2_ = 0x4c4c;
    local_e0._8_8_ = 6;
    local_d0._M_local_buf[6] = '\0';
    local_e0._M_allocated_capacity = (size_type)&local_d0;
    getEnvironmentVariable((string *)&local_70,(string *)&local_d0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e0._M_allocated_capacity != &local_d0) {
      operator_delete((void *)local_e0._M_allocated_capacity,
                      CONCAT17(local_d0._M_local_buf[7],
                               CONCAT16(local_d0._M_local_buf[6],
                                        CONCAT24(local_d0._M_allocated_capacity._4_2_,
                                                 local_d0._M_allocated_capacity._0_4_))) + 1);
    }
    local_80._M_allocated_capacity = 0x45505954435f434c;
    local_90._8_8_ = 8;
    local_80._M_local_buf[8] = '\0';
    local_90._M_allocated_capacity = (size_type)&local_80;
    getEnvironmentVariable((string *)&local_e0,(string *)&local_80);
    local_98 = title;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_allocated_capacity != &local_80) {
      operator_delete((void *)local_90._M_allocated_capacity,local_80._M_allocated_capacity + 1);
    }
    local_40 = 0x474e414c;
    local_48 = 4;
    uStack_3c = uStack_3c & 0xffffff00;
    local_50 = (string *)&local_40;
    getEnvironmentVariable((string *)&local_90,(string *)&local_40);
    if (local_50 != (string *)&local_40) {
      operator_delete(local_50,CONCAT44(uStack_3c,local_40) + 1);
    }
    paVar4 = &local_e0;
    if (local_e0._8_8_ == 0) {
      paVar4 = &local_90;
    }
    paVar3 = &local_70;
    if (local_70._8_8_ == 0) {
      paVar3 = paVar4;
    }
    lVar2 = std::__cxx11::string::find(paVar3->_M_local_buf,0x18618f,0);
    bVar5 = true;
    if (lVar2 == -1) {
      lVar2 = std::__cxx11::string::find(paVar3->_M_local_buf,0x186195,0);
      bVar5 = lVar2 != -1;
    }
    psVar1 = local_98;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_allocated_capacity != &local_80) {
      operator_delete((void *)local_90._M_allocated_capacity,local_80._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e0._M_allocated_capacity != &local_d0) {
      operator_delete((void *)local_e0._M_allocated_capacity,
                      CONCAT17(local_d0._M_local_buf[7],
                               CONCAT16(local_d0._M_local_buf[6],
                                        CONCAT24(local_d0._M_allocated_capacity._4_2_,
                                                 local_d0._M_allocated_capacity._0_4_))) + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_allocated_capacity != &local_60) {
      operator_delete((void *)local_70._M_allocated_capacity,local_60._M_allocated_capacity + 1);
    }
    if (!bVar5) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,
                 "\n\nThis application requires a UTF-8 compatible LANG environment variable to be set in the controlling terminal. Setting to C.UTF-8. Depending on your environment, you may see corrupted output. If that\'st he case, try to set LANG=C.UTF-8 before starting musikcube.\n\n\n\n"
                 ,0x10b);
      setenv("LANG","C.UTF-8",1);
    }
    instance = this;
    this->minWidth = 0;
    this->minHeight = 0;
    this->mouseEnabled = true;
    this->quit = false;
    setlocale(6,"");
    signal(1,hangupHandler);
    signal(0x1c,resizedHandler);
    signal(0xd,(__sighandler_t)0x1);
    this->colorMode = Palette;
    InitCurses(this);
    SetTitle(this,psVar1);
    return;
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(this_00,"app instance already running!");
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

App::App(const std::string& title) {
    if (instance) {
        throw std::runtime_error("app instance already running!");
    }

#ifndef WIN32
    if (!isLangUtf8()) {
        std::cout << "\n\nThis application requires a UTF-8 compatible LANG environment "
        "variable to be set in the controlling terminal. Setting to C.UTF-8. Depending on "
        "your environment, you may see corrupted output. If that'st he case, try to set "
        "LANG=C.UTF-8 before starting musikcube.\n\n\n\n";
        setenv("LANG", "C.UTF-8", 1);
    }
#endif

    instance = this; /* only one instance. */
    this->quit = false;
    this->minWidth = this->minHeight = 0;
    this->mouseEnabled = true;

#ifdef WIN32
    this->iconId = 0;
    this->colorMode = Colors::RGB;
    win32::ConfigureDpiAwareness();
#else
    setlocale(LC_ALL, "");
    std::signal(SIGHUP, hangupHandler);
    std::signal(SIGWINCH, resizedHandler);
    std::signal(SIGPIPE, SIG_IGN);
    this->colorMode = Colors::Palette;
#endif

    this->InitCurses();
    this->SetTitle(title);
}